

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O3

_array * array_client_getbuf(t_array_client *x,_glist **glist)

{
  _scalar *p_Var1;
  int iVar2;
  _garray *x_00;
  _glist *p_Var3;
  _array *p_Var4;
  t_template *x_01;
  char *pcVar5;
  char *fmt;
  t_gstub *ptVar6;
  long lVar7;
  int type;
  int onset;
  t_symbol *arraytype;
  int local_38;
  int local_34;
  t_symbol *local_30;
  
  if (x->tc_sym == (t_symbol *)0x0) {
    if (x->tc_struct != (t_symbol *)0x0) {
      x_01 = template_findbyname(x->tc_struct);
      if (x_01 == (t_template *)0x0) {
        pcVar5 = x->tc_struct->s_name;
        fmt = "array: couldn\'t find struct %s";
      }
      else {
        ptVar6 = (x->tc_gp).gp_stub;
        iVar2 = gpointer_check(&x->tc_gp,0);
        if (iVar2 == 0) {
          pd_error(x,"array: stale or empty pointer");
          return (_array *)0x0;
        }
        lVar7 = 0x18;
        if (ptVar6->gs_which == 2) {
          lVar7 = 0;
        }
        p_Var1 = (x->tc_gp).gp_un.gp_scalar;
        iVar2 = template_find_field(x_01,x->tc_field,&local_34,&local_38,&local_30);
        if (iVar2 == 0) {
          pcVar5 = x->tc_field->s_name;
          fmt = "array: no field named %s";
        }
        else {
          if (local_38 == 3) {
            if (ptVar6->gs_which != 1) {
              do {
                ptVar6 = (t_gstub *)((ptVar6->gs_un).gs_glist)->gl_list;
              } while (ptVar6->gs_which == 2);
            }
            *glist = (_glist *)ptVar6->gs_un;
            return *(_array **)((long)p_Var1->sc_vec + local_34 + lVar7 + -0x18);
          }
          pcVar5 = x->tc_field->s_name;
          fmt = "array: field %s not of type array";
        }
      }
      pd_error(x,fmt,pcVar5);
    }
  }
  else {
    x_00 = (_garray *)pd_findbyclass(x->tc_sym,garray_class);
    if (x_00 != (_garray *)0x0) {
      p_Var3 = garray_getglist(x_00);
      *glist = p_Var3;
      p_Var4 = garray_getarray(x_00);
      return p_Var4;
    }
    pd_error(x,"array: couldn\'t find named array \'%s\'",x->tc_sym->s_name);
    *glist = (_glist *)0x0;
  }
  return (_array *)0x0;
}

Assistant:

static t_array *array_client_getbuf(t_array_client *x, t_glist **glist)
{
    if (x->tc_sym)       /* named array object */
    {
        t_garray *y = (t_garray *)pd_findbyclass(x->tc_sym, garray_class);
        if (y)
        {
            *glist = garray_getglist(y);
            return (garray_getarray(y));
        }
        else
        {
            pd_error(x, "array: couldn't find named array '%s'",
                x->tc_sym->s_name);
            *glist = 0;
            return (0);
        }
    }
    else if (x->tc_struct)   /* by pointer */
    {
        t_template *template = template_findbyname(x->tc_struct);
        t_gstub *gs = x->tc_gp.gp_stub;
        t_word *vec;
        int onset, type;
        t_symbol *arraytype;
        if (!template)
        {
            pd_error(x, "array: couldn't find struct %s", x->tc_struct->s_name);
            return (0);
        }
        if (!gpointer_check(&x->tc_gp, 0))
        {
            pd_error(x, "array: stale or empty pointer");
            return (0);
        }
        if (gs->gs_which == GP_ARRAY)
            vec = x->tc_gp.gp_un.gp_w;
        else vec = x->tc_gp.gp_un.gp_scalar->sc_vec;

        if (!template_find_field(template,
            x->tc_field, &onset, &type, &arraytype))
        {
            pd_error(x, "array: no field named %s", x->tc_field->s_name);
            return (0);
        }
        if (type != DT_ARRAY)
        {
            pd_error(x, "array: field %s not of type array",
                x->tc_field->s_name);
            return (0);
        }
        if (gs->gs_which == GP_GLIST)
            *glist = gs->gs_un.gs_glist;
        else
        {
            t_array *owner_array = gs->gs_un.gs_array;
            while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
                owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
            *glist = owner_array->a_gp.gp_stub->gs_un.gs_glist;
        }
        return (*(t_array **)(((char *)vec) + onset));
    }
    else return (0);    /* shouldn't happen */
}